

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void tile_mt_queue(AV1Decoder *pbi,int tile_cols,int tile_rows,int tile_rows_start,int tile_rows_end
                  ,int tile_cols_start,int tile_cols_end,int start_tile,int end_tile)

{
  int *piVar1;
  size_t size;
  pthread_mutex_t *ppVar2;
  TileJobsDec *pTVar3;
  long lVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  TileBufferDec *pTVar10;
  long lVar11;
  long lVar12;
  TileJobsDec *pTVar13;
  TileBufferDec *pTVar14;
  
  if (((pbi->tile_mt_info).alloc_tile_cols != tile_cols) ||
     ((pbi->tile_mt_info).alloc_tile_rows != tile_rows)) {
    av1_dealloc_dec_jobs(&pbi->tile_mt_info);
    (pbi->tile_mt_info).alloc_tile_rows = tile_rows;
    (pbi->tile_mt_info).alloc_tile_cols = tile_cols;
    iVar6 = tile_rows * tile_cols;
    size = (long)iVar6 * 0x28;
    ppVar2 = (pthread_mutex_t *)aom_malloc(size);
    (pbi->tile_mt_info).job_mutex = ppVar2;
    if (ppVar2 == (pthread_mutex_t *)0x0) {
      aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate tile_mt_info->job_mutex");
    }
    if (0 < iVar6) {
      sVar5 = 0;
      do {
        pthread_mutex_init((pthread_mutex_t *)((long)(pbi->tile_mt_info).job_mutex + sVar5),
                           (pthread_mutexattr_t *)0x0);
        sVar5 = sVar5 + 0x28;
      } while (size != sVar5);
    }
    pTVar3 = (TileJobsDec *)aom_malloc((long)iVar6 << 4);
    (pbi->tile_mt_info).job_queue = pTVar3;
    if (pTVar3 == (TileJobsDec *)0x0) {
      aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate tile_mt_info->job_queue");
    }
  }
  pTVar3 = (pbi->tile_mt_info).job_queue;
  (pbi->tile_mt_info).jobs_enqueued = 0;
  (pbi->tile_mt_info).jobs_dequeued = 0;
  if (tile_rows_start < tile_rows_end) {
    lVar4 = (long)tile_cols_start;
    lVar9 = (long)tile_rows_start;
    lVar11 = lVar9 * 0x53a0;
    pTVar10 = pbi->tile_buffers[lVar9] + lVar4;
    pTVar13 = pTVar3;
    do {
      if (tile_cols_start < tile_cols_end) {
        lVar7 = (long)(pbi->common).tiles.cols;
        lVar12 = lVar11 * lVar7 + lVar4 * 0x53a0;
        lVar8 = lVar7 * lVar9 + lVar4;
        lVar7 = tile_cols_end - lVar4;
        pTVar14 = pTVar10;
        do {
          if (lVar8 <= end_tile && start_tile <= lVar8) {
            pTVar13->tile_buffer = pTVar14;
            pTVar13->tile_data =
                 (TileDataDec *)((long)((pbi->tile_data->tctx).txb_skip_cdf + -2) + 0x3c + lVar12);
            pTVar13 = pTVar13 + 1;
            piVar1 = &(pbi->tile_mt_info).jobs_enqueued;
            *piVar1 = *piVar1 + 1;
          }
          lVar12 = lVar12 + 0x53a0;
          pTVar14 = pTVar14 + 1;
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      lVar9 = lVar9 + 1;
      lVar11 = lVar11 + 0x53a0;
      pTVar10 = pTVar10 + 0x40;
    } while (lVar9 != tile_rows_end);
  }
  qsort(pTVar3,(long)(pbi->tile_mt_info).jobs_enqueued,0x10,compare_tile_buffers);
  return;
}

Assistant:

static inline void tile_mt_queue(AV1Decoder *pbi, int tile_cols, int tile_rows,
                                 int tile_rows_start, int tile_rows_end,
                                 int tile_cols_start, int tile_cols_end,
                                 int start_tile, int end_tile) {
  AV1_COMMON *const cm = &pbi->common;
  if (pbi->tile_mt_info.alloc_tile_cols != tile_cols ||
      pbi->tile_mt_info.alloc_tile_rows != tile_rows) {
    av1_dealloc_dec_jobs(&pbi->tile_mt_info);
    alloc_dec_jobs(&pbi->tile_mt_info, cm, tile_rows, tile_cols);
  }
  enqueue_tile_jobs(pbi, cm, tile_rows_start, tile_rows_end, tile_cols_start,
                    tile_cols_end, start_tile, end_tile);
  qsort(pbi->tile_mt_info.job_queue, pbi->tile_mt_info.jobs_enqueued,
        sizeof(pbi->tile_mt_info.job_queue[0]), compare_tile_buffers);
}